

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_default_vfs_info(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  ma_file_info *pInfo_local;
  ma_vfs_file file_local;
  ma_vfs *pVFS_local;
  
  if (pInfo == (ma_file_info *)0x0) {
    pVFS_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pInfo,0,8);
    if (file == (ma_vfs_file)0x0) {
      pVFS_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      pVFS_local._4_4_ = ma_default_vfs_info__stdio(pVFS,file,pInfo);
    }
  }
  return pVFS_local._4_4_;
}

Assistant:

static ma_result ma_default_vfs_info(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    if (pInfo == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pInfo);

    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_WIN32) && defined(MA_WIN32_DESKTOP) && !defined(MA_NO_WIN32_FILEIO)
    return ma_default_vfs_info__win32(pVFS, file, pInfo);
#else
    return ma_default_vfs_info__stdio(pVFS, file, pInfo);
#endif
}